

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

void parasail_result_free(parasail_result_t *result)

{
  uint uVar1;
  parasail_result_extra_trace_t *__ptr;
  
  if (result == (parasail_result_t *)0x0) {
    parasail_result_free_cold_1();
    return;
  }
  uVar1 = result->flag;
  if ((uVar1 >> 0x10 & 1) == 0) {
    if ((uVar1 >> 0x11 & 1) != 0) {
      free(((result->field_4).trace)->trace_table);
      free((result->field_4).extra);
      uVar1 = result->flag;
    }
    if ((uVar1 >> 0x12 & 1) == 0) goto LAB_004b4242;
    free(((result->field_4).trace)->trace_table);
    free(((result->field_4).trace)->trace_ins_table);
  }
  else {
    if ((uVar1 >> 0x11 & 1) != 0) {
      free(*((result->field_4).trace)->trace_del_table);
      free(*(void **)((long)((result->field_4).trace)->trace_del_table + 8));
      free(*(void **)((long)((result->field_4).trace)->trace_del_table + 0x10));
      free(*(void **)((long)((result->field_4).trace)->trace_del_table + 0x18));
      free(((result->field_4).trace)->trace_del_table);
      uVar1 = result->flag;
    }
    if ((uVar1 >> 0x12 & 1) != 0) {
      free(*((result->field_4).trace)->trace_del_table);
      free(*(void **)((long)((result->field_4).trace)->trace_del_table + 8));
      free(*(void **)((long)((result->field_4).trace)->trace_del_table + 0x10));
      free(*(void **)((long)((result->field_4).trace)->trace_del_table + 0x18));
      free(*(void **)((long)((result->field_4).trace)->trace_del_table + 0x20));
      free(*(void **)((long)((result->field_4).trace)->trace_del_table + 0x28));
      free(*(void **)((long)((result->field_4).trace)->trace_del_table + 0x30));
      free(*(void **)((long)((result->field_4).trace)->trace_del_table + 0x38));
      free(((result->field_4).trace)->trace_del_table);
    }
  }
  free((result->field_4).extra);
LAB_004b4242:
  if ((result->flag & 0x80000) != 0) {
    free(((result->field_4).trace)->trace_table);
    __ptr = (result->field_4).trace;
    if (__ptr->trace_ins_table != (void *)0x0) {
      free(__ptr->trace_ins_table);
      __ptr = (result->field_4).trace;
    }
    if (__ptr->trace_del_table != (void *)0x0) {
      free(__ptr->trace_del_table);
      __ptr = (parasail_result_extra_trace_t *)(result->field_4).extra;
    }
    free(__ptr);
  }
  free(result);
  return;
}

Assistant:

void parasail_result_free(parasail_result_t *result)
{
    /* validate inputs */
    if (!result) {
        fprintf(stderr, "%s: attempted free of NULL result pointer\n", __func__);
        return;
    }
    
    if (result->flag & PARASAIL_FLAG_STATS) {
        if (result->flag & PARASAIL_FLAG_TABLE) {
            free(result->stats->tables->score_table);
            free(result->stats->tables->matches_table);
            free(result->stats->tables->similar_table);
            free(result->stats->tables->length_table);
            free(result->stats->tables);
        }
        if (result->flag & PARASAIL_FLAG_ROWCOL) {
            free(result->stats->rowcols->score_row);
            free(result->stats->rowcols->matches_row);
            free(result->stats->rowcols->similar_row);
            free(result->stats->rowcols->length_row);
            free(result->stats->rowcols->score_col);
            free(result->stats->rowcols->matches_col);
            free(result->stats->rowcols->similar_col);
            free(result->stats->rowcols->length_col);
            free(result->stats->rowcols);
        }
        free(result->stats);
    }
    else {
        if (result->flag & PARASAIL_FLAG_TABLE) {
            free(result->tables->score_table);
            free(result->tables);
        }
        if (result->flag & PARASAIL_FLAG_ROWCOL) {
            free(result->rowcols->score_row);
            free(result->rowcols->score_col);
            free(result->rowcols);
        }
    }
    if (result->flag & PARASAIL_FLAG_TRACE) {
        parasail_free(result->trace->trace_table);
        if (NULL != result->trace->trace_ins_table)
            parasail_free(result->trace->trace_ins_table);
        if (NULL != result->trace->trace_del_table)
            parasail_free(result->trace->trace_del_table);
        free(result->trace);
    }

    free(result);
}